

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Curl_tree *pCVar3;
  timediff_t tVar4;
  curltime cVar5;
  curltime older;
  curltime newer;
  uint local_44;
  uint local_40;
  uint local_3c;
  timediff_t diff;
  curltime now;
  long *timeout_ms_local;
  Curl_multi *multi_local;
  
  if (((byte)multi->field_0x1b1 >> 4 & 1) == 0) {
    if (multi->timetree == (Curl_tree *)0x0) {
      *timeout_ms = -1;
    }
    else {
      cVar5 = Curl_now();
      pCVar3 = Curl_splay((curltime)ZEXT816((ulong)0),multi->timetree);
      multi->timetree = pCVar3;
      if ((multi->timetree->key).tv_sec < cVar5.tv_sec) {
        local_3c = 0xffffffff;
      }
      else {
        if (cVar5.tv_sec < (multi->timetree->key).tv_sec) {
          local_40 = 1;
        }
        else {
          if ((multi->timetree->key).tv_usec < cVar5.tv_usec) {
            local_44 = 0xffffffff;
          }
          else {
            local_44 = (uint)(cVar5.tv_usec < (multi->timetree->key).tv_usec);
          }
          local_40 = local_44;
        }
        local_3c = local_40;
      }
      if ((int)local_3c < 1) {
        *timeout_ms = 0;
      }
      else {
        uVar1 = (multi->timetree->key).tv_sec;
        uVar2 = (multi->timetree->key).tv_usec;
        newer.tv_usec = uVar2;
        newer.tv_sec = uVar1;
        older._12_4_ = 0;
        older.tv_sec = SUB128(cVar5._0_12_,0);
        older.tv_usec = SUB124(cVar5._0_12_,8);
        newer._12_4_ = 0;
        tVar4 = Curl_timediff_ceil(newer,older);
        *timeout_ms = tVar4;
      }
    }
  }
  else {
    *timeout_ms = 0;
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static const struct curltime tv_zero = {0, 0};

  if(multi->dead) {
    *timeout_ms = 0;
    return CURLM_OK;
  }

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff_ceil(multi->timetree->key, now);
      /* this should be safe even on 32 bit archs, as we don't use that
         overly long timeouts */
      *timeout_ms = (long)diff;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}